

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myexpand.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  FILE *__stream;
  char *__ptr;
  size_t sStack_40;
  
  name = *argv;
  lVar2 = 8;
  while( true ) {
    iVar1 = __posix_getopt(argc,argv,"t:");
    if (iVar1 != 0x74) break;
    lVar2 = strtol(_optarg,(char **)0x0,10);
  }
  if (iVar1 == -1) {
    iVar1 = (int)lVar2;
    if (0 < iVar1) {
      lVar2 = (long)_optind;
      if (_optind == argc) {
        read_file(_stdin,iVar1);
      }
      else {
        for (; lVar2 < argc; lVar2 = lVar2 + 1) {
          __stream = fopen(argv[lVar2],"r");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"%s ERROR:\t",name);
            __ptr = "unable to open file";
            sStack_40 = 0x13;
            goto LAB_00101256;
          }
          read_file((FILE *)__stream,iVar1);
          fclose(__stream);
        }
      }
      exit(0);
    }
    fprintf(_stderr,"%s ERROR:\t",name);
    __ptr = "value of -t is invalid";
    sStack_40 = 0x16;
LAB_00101256:
    fwrite(__ptr,sStack_40,1,_stderr);
    fputc(10,_stderr);
  }
  else {
    fprintf(_stdout,"USAGE: %s [-t tabstop] [file...]",name);
  }
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{

	name = argv[0];

	int tabstop = 8;
	int opt;
	while ((opt = getopt(argc, argv, "t:")) != -1)
	{
		switch (opt)
		{
		case 't':
			tabstop = (int)strtol(optarg, (char **)NULL, 10);
			break;
		default:
			USAGE();
		}
	}

	if (tabstop <= 0)
	{
		ERROR_EXIT("value of -t is invalid");
	}

	if (optind == argc)
	{
		read_file(stdin, tabstop);
		exit(EXIT_SUCCESS);
	}
	else
	{
		for (int i = optind; i < argc; i++)
		{
			FILE *input = fopen(argv[i], "r");
			if (input == NULL)
			{
				ERROR_EXIT("unable to open file");
			}
			read_file(input, tabstop);
			fclose(input);
		}
		exit(EXIT_SUCCESS);
	}
}